

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiWindow::ImGuiWindow(ImGuiWindow *this,ImGuiContext *context,char *name)

{
  ImU32 IVar1;
  ImGuiID IVar2;
  char *pcVar3;
  size_t sVar4;
  ImRect *local_d0;
  ImRect local_94;
  ImRect local_84;
  ImVec2 local_74;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  ImVec2 local_34 [2];
  char *local_20;
  char *name_local;
  ImGuiContext *context_local;
  ImGuiWindow *this_local;
  
  local_20 = name;
  name_local = &context->Initialized;
  context_local = (ImGuiContext *)this;
  ImVec2::ImVec2(&this->Pos);
  ImVec2::ImVec2(&this->Size);
  ImVec2::ImVec2(&this->SizeFull);
  ImVec2::ImVec2(&this->ContentSize);
  ImVec2::ImVec2(&this->ContentSizeExplicit);
  ImVec2::ImVec2(&this->WindowPadding);
  ImVec2::ImVec2(&this->Scroll);
  ImVec2::ImVec2(&this->ScrollMax);
  ImVec2::ImVec2(&this->ScrollTarget);
  ImVec2::ImVec2(&this->ScrollTargetCenterRatio);
  ImVec2::ImVec2(&this->ScrollbarSizes);
  ImVec2::ImVec2(&this->SetWindowPosVal);
  ImVec2::ImVec2(&this->SetWindowPosPivot);
  ImVector<unsigned_int>::ImVector(&this->IDStack);
  ImGuiWindowTempData::ImGuiWindowTempData(&this->DC);
  ImRect::ImRect(&this->OuterRectClipped);
  ImRect::ImRect(&this->InnerRect);
  ImRect::ImRect(&this->InnerClipRect);
  ImRect::ImRect(&this->WorkRect);
  ImRect::ImRect(&this->ClipRect);
  ImRect::ImRect(&this->ContentsRegionRect);
  ImGuiMenuColumns::ImGuiMenuColumns(&this->MenuColumns);
  ImGuiStorage::ImGuiStorage(&this->StateStorage);
  ImVector<ImGuiColumns>::ImVector(&this->ColumnsStorage);
  ImDrawList::ImDrawList(&this->DrawListInst,(ImDrawListSharedData *)(name_local + 0x1918));
  local_d0 = this->NavRectRel;
  do {
    ImRect::ImRect(local_d0);
    local_d0 = local_d0 + 1;
  } while (local_d0 != (ImRect *)&this->MemoryCompacted);
  pcVar3 = ImStrdup(local_20);
  this->Name = pcVar3;
  IVar1 = ImHashStr(local_20,0,0);
  this->ID = IVar1;
  ImVector<unsigned_int>::push_back(&this->IDStack,&this->ID);
  this->Flags = 0;
  ImVec2::ImVec2(local_34,0.0,0.0);
  this->Pos = local_34[0];
  ImVec2::ImVec2(&local_3c,0.0,0.0);
  this->SizeFull = local_3c;
  this->Size = this->SizeFull;
  ImVec2::ImVec2(&local_44,0.0,0.0);
  this->ContentSizeExplicit = local_44;
  this->ContentSize = this->ContentSizeExplicit;
  ImVec2::ImVec2(&local_4c,0.0,0.0);
  this->WindowPadding = local_4c;
  this->WindowRounding = 0.0;
  this->WindowBorderSize = 0.0;
  sVar4 = strlen(local_20);
  this->NameBufLen = (int)sVar4 + 1;
  IVar2 = GetID(this,"#MOVE",(char *)0x0);
  this->MoveId = IVar2;
  this->ChildId = 0;
  ImVec2::ImVec2(&local_54,0.0,0.0);
  this->Scroll = local_54;
  ImVec2::ImVec2(&local_5c,3.4028235e+38,3.4028235e+38);
  this->ScrollTarget = local_5c;
  ImVec2::ImVec2(&local_64,0.5,0.5);
  this->ScrollTargetCenterRatio = local_64;
  ImVec2::ImVec2(&local_6c,0.0,0.0);
  this->ScrollbarSizes = local_6c;
  this->ScrollbarY = false;
  this->ScrollbarX = false;
  this->WasActive = false;
  this->Active = false;
  this->WriteAccessed = false;
  this->Collapsed = false;
  this->WantCollapseToggle = false;
  this->SkipItems = false;
  this->Appearing = false;
  this->Hidden = false;
  this->HasCloseButton = false;
  this->ResizeBorderHeld = -1;
  this->BeginCount = 0;
  this->BeginOrderWithinParent = -1;
  this->BeginOrderWithinContext = -1;
  this->PopupId = 0;
  this->AutoFitFramesY = -1;
  this->AutoFitFramesX = -1;
  this->AutoFitChildAxises = '\0';
  this->AutoFitOnlyGrows = false;
  this->AutoPosLastDirection = -1;
  this->HiddenFramesCannotSkipItems = 0;
  this->HiddenFramesCanSkipItems = 0;
  this->SetWindowCollapsedAllowFlags = 0xf;
  this->SetWindowSizeAllowFlags = 0xf;
  this->SetWindowPosAllowFlags = 0xf;
  ImVec2::ImVec2(&local_74,3.4028235e+38,3.4028235e+38);
  this->SetWindowPosPivot = local_74;
  this->SetWindowPosVal = this->SetWindowPosPivot;
  ImRect::ImRect(&local_84,0.0,0.0,0.0,0.0);
  (this->InnerRect).Min = local_84.Min;
  (this->InnerRect).Max = local_84.Max;
  this->LastFrameActive = -1;
  this->LastTimeActive = -1.0;
  this->ItemWidthDefault = 0.0;
  this->FontWindowScale = 1.0;
  this->SettingsIdx = -1;
  this->DrawList = &this->DrawListInst;
  this->DrawList->_OwnerName = this->Name;
  this->ParentWindow = (ImGuiWindow *)0x0;
  this->RootWindow = (ImGuiWindow *)0x0;
  this->RootWindowForTitleBarHighlight = (ImGuiWindow *)0x0;
  this->RootWindowForNav = (ImGuiWindow *)0x0;
  this->NavLastIds[1] = 0;
  this->NavLastIds[0] = 0;
  ImRect::ImRect(&local_94);
  this->NavRectRel[1].Min = local_94.Min;
  this->NavRectRel[1].Max = local_94.Max;
  this->NavRectRel[0].Min = this->NavRectRel[1].Min;
  this->NavRectRel[0].Max = this->NavRectRel[1].Max;
  this->NavLastChildNavWindow = (ImGuiWindow *)0x0;
  this->MemoryCompacted = false;
  this->MemoryDrawListVtxCapacity = 0;
  this->MemoryDrawListIdxCapacity = 0;
  return;
}

Assistant:

ImGuiWindow::ImGuiWindow(ImGuiContext* context, const char* name)
    : DrawListInst(&context->DrawListSharedData)
{
    Name = ImStrdup(name);
    ID = ImHashStr(name);
    IDStack.push_back(ID);
    Flags = ImGuiWindowFlags_None;
    Pos = ImVec2(0.0f, 0.0f);
    Size = SizeFull = ImVec2(0.0f, 0.0f);
    ContentSize = ContentSizeExplicit = ImVec2(0.0f, 0.0f);
    WindowPadding = ImVec2(0.0f, 0.0f);
    WindowRounding = 0.0f;
    WindowBorderSize = 0.0f;
    NameBufLen = (int)strlen(name) + 1;
    MoveId = GetID("#MOVE");
    ChildId = 0;
    Scroll = ImVec2(0.0f, 0.0f);
    ScrollTarget = ImVec2(FLT_MAX, FLT_MAX);
    ScrollTargetCenterRatio = ImVec2(0.5f, 0.5f);
    ScrollbarSizes = ImVec2(0.0f, 0.0f);
    ScrollbarX = ScrollbarY = false;
    Active = WasActive = false;
    WriteAccessed = false;
    Collapsed = false;
    WantCollapseToggle = false;
    SkipItems = false;
    Appearing = false;
    Hidden = false;
    HasCloseButton = false;
    ResizeBorderHeld = -1;
    BeginCount = 0;
    BeginOrderWithinParent = -1;
    BeginOrderWithinContext = -1;
    PopupId = 0;
    AutoFitFramesX = AutoFitFramesY = -1;
    AutoFitChildAxises = 0x00;
    AutoFitOnlyGrows = false;
    AutoPosLastDirection = ImGuiDir_None;
    HiddenFramesCanSkipItems = HiddenFramesCannotSkipItems = 0;
    SetWindowPosAllowFlags = SetWindowSizeAllowFlags = SetWindowCollapsedAllowFlags = ImGuiCond_Always | ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing;
    SetWindowPosVal = SetWindowPosPivot = ImVec2(FLT_MAX, FLT_MAX);

    InnerRect = ImRect(0.0f, 0.0f, 0.0f, 0.0f); // Clear so the InnerRect.GetSize() code in Begin() doesn't lead to overflow even if the result isn't used.

    LastFrameActive = -1;
    LastTimeActive = -1.0f;
    ItemWidthDefault = 0.0f;
    FontWindowScale = 1.0f;
    SettingsIdx = -1;

    DrawList = &DrawListInst;
    DrawList->_OwnerName = Name;
    ParentWindow = NULL;
    RootWindow = NULL;
    RootWindowForTitleBarHighlight = NULL;
    RootWindowForNav = NULL;

    NavLastIds[0] = NavLastIds[1] = 0;
    NavRectRel[0] = NavRectRel[1] = ImRect();
    NavLastChildNavWindow = NULL;

    MemoryCompacted = false;
    MemoryDrawListIdxCapacity = MemoryDrawListVtxCapacity = 0;
}